

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O0

ngx_chain_t *
ngx_http_charset_recode_to_utf8(ngx_pool_t *pool,ngx_buf_t *buf,ngx_http_charset_ctx_t *ctx)

{
  u_char *puVar1;
  ngx_buf_t *pnVar2;
  ngx_chain_t *pnVar3;
  ulong uVar4;
  ulong uVar5;
  ngx_chain_t *pnVar6;
  u_char *puVar7;
  ngx_chain_t **local_78;
  ngx_chain_t **ll;
  ngx_chain_t *cl;
  ngx_chain_t *out;
  ngx_buf_t *b;
  u_char *table;
  u_char *dst;
  u_char *src;
  u_char *p;
  size_t size;
  size_t len;
  ngx_http_charset_ctx_t *ctx_local;
  ngx_buf_t *buf_local;
  ngx_pool_t *pool_local;
  
  puVar1 = ctx->table;
  dst = buf->pos;
  while( true ) {
    if (buf->last <= dst) {
      pool_local = (ngx_pool_t *)ngx_alloc_chain_link(pool);
      if (pool_local == (ngx_pool_t *)0x0) {
        pool_local = (ngx_pool_t *)0x0;
      }
      else {
        (pool_local->d).last = (u_char *)buf;
        (pool_local->d).end = (u_char *)0x0;
      }
      return (ngx_chain_t *)pool_local;
    }
    if (puVar1[(int)((uint)*dst << 2)] != '\x01') break;
    dst = dst + 1;
  }
  uVar4 = (long)dst - (long)buf->pos;
  if (uVar4 < 0x201) {
    cl = (ngx_chain_t *)0x0;
    uVar5 = (long)buf->last - (long)dst;
    p = (u_char *)
        (uVar4 + (uVar5 >> 1) + (uVar5 >> 1) * (ulong)(*(uint *)&ctx->field_0x44 & 0xffff));
    dst = buf->pos;
  }
  else {
    cl = ngx_http_charset_get_buf(pool,ctx);
    if (cl == (ngx_chain_t *)0x0) {
      return (ngx_chain_t *)0x0;
    }
    pnVar2 = cl->buf;
    *(ushort *)&pnVar2->field_0x48 =
         *(ushort *)&pnVar2->field_0x48 & 0xfffe | *(ushort *)&buf->field_0x48 & 1;
    *(ushort *)&pnVar2->field_0x48 =
         *(ushort *)&pnVar2->field_0x48 & 0xfffd | (*(ushort *)&buf->field_0x48 >> 1 & 1) << 1;
    *(ushort *)&pnVar2->field_0x48 =
         *(ushort *)&pnVar2->field_0x48 & 0xfffb | (*(ushort *)&buf->field_0x48 >> 2 & 1) << 2;
    *(ushort *)&pnVar2->field_0x48 =
         *(ushort *)&pnVar2->field_0x48 & 0xffdf | (*(ushort *)&buf->field_0x48 >> 5 & 1) << 5;
    pnVar2->pos = buf->pos;
    pnVar2->last = dst;
    cl->buf = pnVar2;
    cl->next = (ngx_chain_t *)0x0;
    uVar4 = (long)buf->last - (long)dst;
    p = (u_char *)((uVar4 >> 1) + (uVar4 >> 1) * (ulong)(*(uint *)&ctx->field_0x44 & 0xffff));
  }
  pnVar6 = ngx_http_charset_get_buffer(pool,ctx,(size_t)p);
  if (pnVar6 != (ngx_chain_t *)0x0) {
    pnVar3 = pnVar6;
    if (cl != (ngx_chain_t *)0x0) {
      cl->next = pnVar6;
      pnVar3 = cl;
    }
    cl = pnVar3;
    local_78 = &pnVar6->next;
    out = (ngx_chain_t *)pnVar6->buf;
    table = ((ngx_buf_t *)out)->pos;
    do {
      if (buf->last <= dst) {
        out->next = (ngx_chain_t *)table;
        *(ushort *)&out[4].next =
             *(ushort *)&out[4].next & 0xff7f | (*(ushort *)&buf->field_0x48 >> 7 & 1) << 7;
        *(ushort *)&out[4].next =
             *(ushort *)&out[4].next & 0xfeff | (*(ushort *)&buf->field_0x48 >> 8 & 1) << 8;
        *(ushort *)&out[4].next =
             *(ushort *)&out[4].next & 0xffdf | (*(ushort *)&buf->field_0x48 >> 5 & 1) << 5;
        out[4].buf = buf;
        return cl;
      }
      puVar7 = dst + 1;
      src = puVar1 + (int)((uint)*dst << 2);
      size = (size_t)*src;
      if ((ulong)((long)out[2].next - (long)table) < size) {
        out->next = (ngx_chain_t *)table;
        uVar4 = (long)buf->last - (long)puVar7;
        pnVar6 = ngx_http_charset_get_buffer
                           (pool,ctx,size + (uVar4 >> 1) +
                                     (uVar4 >> 1) * (ulong)(*(uint *)&ctx->field_0x44 & 0xffff));
        if (pnVar6 == (ngx_chain_t *)0x0) {
          return (ngx_chain_t *)0x0;
        }
        *local_78 = pnVar6;
        local_78 = &pnVar6->next;
        out = (ngx_chain_t *)pnVar6->buf;
        table = ((ngx_buf_t *)out)->pos;
      }
      for (; src = src + 1, dst = puVar7, size != 0; size = size - 1) {
        *table = *src;
        table = table + 1;
      }
    } while( true );
  }
  return (ngx_chain_t *)0x0;
}

Assistant:

static ngx_chain_t *
ngx_http_charset_recode_to_utf8(ngx_pool_t *pool, ngx_buf_t *buf,
    ngx_http_charset_ctx_t *ctx)
{
    size_t        len, size;
    u_char       *p, *src, *dst, *table;
    ngx_buf_t    *b;
    ngx_chain_t  *out, *cl, **ll;

    table = ctx->table;

    for (src = buf->pos; src < buf->last; src++) {
        if (table[*src * NGX_UTF_LEN] == '\1') {
            continue;
        }

        goto recode;
    }

    out = ngx_alloc_chain_link(pool);
    if (out == NULL) {
        return NULL;
    }

    out->buf = buf;
    out->next = NULL;

    return out;

recode:

    /*
     * we assume that there are about half of characters to be recoded,
     * so we preallocate "size / 2 + size / 2 * ctx->length"
     */

    len = src - buf->pos;

    if (len > 512) {
        out = ngx_http_charset_get_buf(pool, ctx);
        if (out == NULL) {
            return NULL;
        }

        b = out->buf;

        b->temporary = buf->temporary;
        b->memory = buf->memory;
        b->mmap = buf->mmap;
        b->flush = buf->flush;

        b->pos = buf->pos;
        b->last = src;

        out->buf = b;
        out->next = NULL;

        size = buf->last - src;
        size = size / 2 + size / 2 * ctx->length;

    } else {
        out = NULL;

        size = buf->last - src;
        size = len + size / 2 + size / 2 * ctx->length;

        src = buf->pos;
    }

    cl = ngx_http_charset_get_buffer(pool, ctx, size);
    if (cl == NULL) {
        return NULL;
    }

    if (out) {
        out->next = cl;

    } else {
        out = cl;
    }

    ll = &cl->next;

    b = cl->buf;
    dst = b->pos;

    while (src < buf->last) {

        p = &table[*src++ * NGX_UTF_LEN];
        len = *p++;

        if ((size_t) (b->end - dst) < len) {
            b->last = dst;

            size = buf->last - src;
            size = len + size / 2 + size / 2 * ctx->length;

            cl = ngx_http_charset_get_buffer(pool, ctx, size);
            if (cl == NULL) {
                return NULL;
            }

            *ll = cl;
            ll = &cl->next;

            b = cl->buf;
            dst = b->pos;
        }

        while (len) {
            *dst++ = *p++;
            len--;
        }
    }

    b->last = dst;

    b->last_buf = buf->last_buf;
    b->last_in_chain = buf->last_in_chain;
    b->flush = buf->flush;

    b->shadow = buf;

    return out;
}